

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.h
# Opt level: O0

void __thiscall
rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::
DoCopyMembers<rapidjson::CrtAllocator>
          (GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this,
          GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs,CrtAllocator *allocator,
          bool copyConstStrings)

{
  SizeType capacity;
  Type TVar1;
  Member *members;
  Member *pMVar2;
  uint local_3c;
  SizeType i;
  Member *rm;
  Member *lm;
  SizeType count;
  bool copyConstStrings_local;
  CrtAllocator *allocator_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *rhs_local;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *this_local;
  
  TVar1 = GetType(rhs);
  if (TVar1 == kObjectType) {
    (this->data_).f.flags = 3;
    capacity = (rhs->data_).s.length;
    members = DoAllocMembers(this,capacity,allocator);
    pMVar2 = GetMembersPointer(rhs);
    for (local_3c = 0; local_3c < capacity; local_3c = local_3c + 1) {
      GenericValue<rapidjson::CrtAllocator>
                (&members[local_3c].name,&pMVar2[local_3c].name,allocator,copyConstStrings);
      GenericValue<rapidjson::CrtAllocator>
                (&members[local_3c].value,&pMVar2[local_3c].value,allocator,copyConstStrings);
    }
    (this->data_).s.hashcode = capacity;
    (this->data_).s.length = capacity;
    SetMembersPointer(this,members);
    return;
  }
  __assert_fail("rhs.GetType() == kObjectType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Forestryks[P]libsbox/external/include/rapidjson/document.h"
                ,0x94c,
                "void rapidjson::GenericValue<rapidjson::UTF8<>, rapidjson::CrtAllocator>::DoCopyMembers(const GenericValue<Encoding, SourceAllocator> &, Allocator &, bool) [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::CrtAllocator, SourceAllocator = rapidjson::CrtAllocator]"
               );
}

Assistant:

void DoCopyMembers(const GenericValue<Encoding,SourceAllocator>& rhs, Allocator& allocator, bool copyConstStrings) {
        RAPIDJSON_ASSERT(rhs.GetType() == kObjectType);

        data_.f.flags = kObjectFlag;
        SizeType count = rhs.data_.o.size;
        Member* lm = DoAllocMembers(count, allocator);
        const typename GenericValue<Encoding,SourceAllocator>::Member* rm = rhs.GetMembersPointer();
#if RAPIDJSON_USE_MEMBERSMAP
        Map* &map = GetMap(lm);
        MapIterator* mit = GetMapIterators(map);
#endif
        for (SizeType i = 0; i < count; i++) {
            new (&lm[i].name) GenericValue(rm[i].name, allocator, copyConstStrings);
            new (&lm[i].value) GenericValue(rm[i].value, allocator, copyConstStrings);
#if RAPIDJSON_USE_MEMBERSMAP
            new (&mit[i]) MapIterator(map->insert(MapPair(lm[i].name.data_, i)));
#endif
        }
        data_.o.size = data_.o.capacity = count;
        SetMembersPointer(lm);
    }